

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O0

double opengv::relative_pose::modules::ge::getCost
                 (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,
                 Matrix3d *zxF,Matrix<double,_3,_9,_0,_3,_9> *x1P,Matrix<double,_3,_9,_0,_3,_9> *y1P
                 ,Matrix<double,_3,_9,_0,_3,_9> *z1P,Matrix<double,_3,_9,_0,_3,_9> *x2P,
                 Matrix<double,_3,_9,_0,_3,_9> *y2P,Matrix<double,_3,_9,_0,_3,_9> *z2P,
                 Matrix<double,_9,_9,_0,_9,_9> *m11P,Matrix<double,_9,_9,_0,_9,_9> *m12P,
                 Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *cayley,int step)

{
  Scalar *pSVar1;
  Vector4d *in_stack_00000008;
  double cost;
  Vector4d roots;
  Matrix3d *in_stack_00000450;
  Matrix3d *in_stack_00000458;
  Matrix3d *in_stack_00000460;
  Matrix3d *in_stack_00000468;
  Matrix3d *in_stack_00000470;
  Matrix3d *in_stack_00000478;
  Scalar local_c8;
  cayley_t local_c0 [6];
  
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x12d5660);
  getEV(in_stack_00000478,in_stack_00000470,in_stack_00000468,in_stack_00000460,in_stack_00000458,
        in_stack_00000450,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,local_c0,in_stack_00000008);
  local_c8 = 0.0;
  if ((int)cayley == 0) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)x1P,
                        (Index)in_stack_00000008);
    local_c8 = *pSVar1;
  }
  if ((int)cayley == 1) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)x1P,
                        (Index)in_stack_00000008);
    local_c8 = *pSVar1;
  }
  return local_c8;
}

Assistant:

double
opengv::relative_pose::modules::ge::getCost(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & cayley,
    int step )
{
  Eigen::Vector4d roots;
  getEV(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley,roots);
  
  double cost = 0.0;
  
  if( step == 0 )
    cost = roots[2];
  if( step == 1 )
    cost = roots[3];
  
  return cost;
}